

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convTest.c
# Opt level: O3

void main(void)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  float *data;
  float *data_00;
  FILE *__s;
  long lVar5;
  long lVar6;
  long lVar7;
  float *data2;
  size_t sVar8;
  char *__s_00;
  float *data1;
  bool bVar9;
  long kernSize;
  long dataSize;
  long N2;
  long local_60;
  long local_58;
  size_t local_50;
  long local_48;
  long local_40 [2];
  
  local_40[1] = 2;
  local_60 = 0x3eb;
  local_40[0] = 0x416;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  lVar4 = lround(11.0);
  bVar1 = (byte)lVar4;
  lVar7 = 1L << (bVar1 & 0x3f);
  printf("fft size = %6ld,  ",lVar7);
  iVar3 = fftInit(lVar4);
  sVar8 = 2L << (bVar1 & 0x3f);
  data = (float *)calloc(sVar8,4);
  if (data == (float *)0x0) {
    iVar3 = 2;
  }
  __s_00 = " out of memory ";
  if (iVar3 != 2) {
    if (iVar3 == 0) {
      data_00 = (float *)calloc(sVar8,4);
      if (data_00 == (float *)0x0) goto LAB_00101514;
      __s = fopen("convdat.cnv","wb");
      if (__s != (FILE *)0x0) {
        local_50 = sVar8;
        local_48 = lVar7;
        fwrite(local_40,8,1,__s);
        fwrite(&local_60,8,1,__s);
        fwrite(local_40 + 1,8,1,__s);
        lVar7 = local_40[0];
        sVar8 = local_40[0] * 4;
        lVar6 = 0;
        bVar2 = true;
        do {
          bVar9 = bVar2;
          lVar5 = lVar6 << (bVar1 & 0x3f);
          if (0 < lVar7) {
            lVar6 = 0;
            do {
              iVar3 = rand();
              (data + lVar5)[lVar6] = (float)iVar3 * 9.313226e-10 + -1.0;
              lVar6 = lVar6 + 1;
            } while (lVar7 != lVar6);
          }
          lVar6 = 1;
          fwrite(data + lVar5,sVar8,1,__s);
          lVar5 = local_60;
          bVar2 = false;
        } while (bVar9);
        sVar8 = local_60 * 4;
        lVar7 = 0;
        bVar2 = true;
        do {
          bVar9 = bVar2;
          lVar6 = lVar7 << (bVar1 & 0x3f);
          if (0 < lVar5) {
            lVar7 = 0;
            do {
              iVar3 = rand();
              (data_00 + lVar6)[lVar7] = (float)iVar3 * 9.313226e-10 + -1.0;
              lVar7 = lVar7 + 1;
            } while (lVar5 != lVar7);
          }
          lVar7 = 1;
          fwrite(data_00 + lVar6,sVar8,1,__s);
          bVar2 = false;
        } while (bVar9);
        rffts(data,lVar4,2);
        local_58 = lVar4;
        rffts(data_00,lVar4,2);
        lVar4 = local_48;
        sVar8 = local_50;
        if (0 < (long)local_50) {
          lVar7 = 0;
          data2 = data_00;
          data1 = data;
          do {
            rspectprod(data1,data2,data1,lVar4);
            lVar7 = lVar7 + lVar4;
            data2 = data2 + lVar4;
            data1 = data1 + lVar4;
          } while (lVar7 < (long)sVar8);
        }
        lVar4 = local_58;
        riffts(data,local_58,2);
        fwrite(data,8L << ((byte)lVar4 & 0x3f),1,__s);
        fclose(__s);
        free(data_00);
        free(data);
        goto LAB_0010151c;
      }
    }
    __s_00 = " error ";
  }
LAB_00101514:
  puts(__s_00);
LAB_0010151c:
  fftFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
const long N2 = 2;		/* the number ffts to test */
long 	N = 2048;		/* size of FFTs, must be power of 2 */
long 	kernSize = 1003;	/* kernal size must be less than N */
long 	dataSize = N-kernSize+1;	/* data size */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);

printf("fft size = %6ld,  ",  N);

if (dataSize <= 0) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fftInit(M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("convdat.cnv", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}


	/* fast convolution of zero padded sequences */
	rffts(a, M, N2);
	rffts(b, M, N2);
	for (i2=0; i2<N2*N; i2+=N){
		rspectprod(&a[i2], &b[i2], &a[i2], N);
	}
	riffts(a, M, N2);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fftFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fftFree();
}
printf(" Done. \n");
return;
}